

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

void __thiscall
QTextDocumentLayoutPrivate::drawFlow
          (QTextDocumentLayoutPrivate *this,QPointF *offset,QPainter *painter,PaintContext *context,
          Iterator it,QList<QTextFrame_*> *floats,QTextBlock *cursorBlockNeedingRepaint)

{
  double dVar1;
  QAbstractTextDocumentLayout *this_00;
  QCheckPoint *pQVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Position PVar6;
  uint objectType;
  QTextFrame *pQVar7;
  QTextObjectInterface *pQVar8;
  long lVar9;
  int i;
  ulong uVar10;
  undefined8 *puVar11;
  QTextDocumentLayoutPrivate *this_01;
  PaintContext *pPVar12;
  QTextFrame *pQVar13;
  int iVar14;
  long in_FS_OFFSET;
  byte bVar15;
  QCheckPoint *local_100;
  qsizetype *local_f0;
  QCheckPoint **local_d8;
  undefined1 local_a8 [16];
  PaintContext pc;
  QTextBlock local_48;
  long local_38;
  
  iVar5 = it.e;
  pQVar13 = it.cf;
  iVar14 = it.cb;
  bVar15 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractTextDocumentLayout **)
             &(this->super_QAbstractTextDocumentLayoutPrivate).field_0x8;
  if ((it.cf == (QTextFrame *)0x0 && it.cb == it.e) || (it.f == (QTextFrame *)0x0)) {
    local_100 = (this->checkPoints).d.ptr + (this->checkPoints).d.size;
  }
  else {
    pQVar7 = QTextFrame::parentFrame(it.f);
    pQVar2 = (this->checkPoints).d.ptr;
    local_100 = pQVar2 + (this->checkPoints).d.size;
    if (pQVar7 == (QTextFrame *)0x0) {
      bVar4 = true;
      if ((0.0 < (context->clip).w) && (dVar1 = (context->clip).h, 0.0 < dVar1)) {
        pc.cursorPosition = (int)((dVar1 + (context->clip).yp) * 64.0);
        local_100 = (QCheckPoint *)
                    std::
                    __lower_bound<QList<QCheckPoint>::const_iterator,QFixed,__gnu_cxx::__ops::_Iter_less_val>
                              (pQVar2,local_100);
      }
      goto LAB_004713fd;
    }
  }
  bVar4 = false;
LAB_004713fd:
  local_d8 = &(this->checkPoints).d.ptr;
  local_f0 = &(this->checkPoints).d.size;
  local_48.p = (QTextDocumentPrivate *)0x0;
  local_48.n = 0;
  local_48._12_4_ = 0xaaaaaaaa;
  pQVar7 = (QTextFrame *)0x0;
  while ((pQVar13 != (QTextFrame *)0x0 || (iVar14 != iVar5))) {
    if ((bVar4 != false) && (*local_f0 != 0)) {
      if (pQVar13 == (QTextFrame *)0x0) {
        QTextFrame::iterator::currentBlock(&it);
        iVar5 = QTextBlock::position((QTextBlock *)&pc);
      }
      else {
        iVar5 = QTextFrame::firstPosition(pQVar13);
      }
      if (((*local_d8)[*local_f0 + -1].positionInFrame <= iVar5) ||
         ((((local_100 != *local_d8 + *local_f0 && (0.0 < (context->clip).w)) &&
           (0.0 < (context->clip).h)) && (local_100->positionInFrame <= iVar5)))) break;
    }
    if (pQVar13 == (QTextFrame *)0x0) {
      puVar11 = &DAT_005fb6b8;
      pPVar12 = &pc;
      for (lVar9 = 10; lVar9 != 0; lVar9 = lVar9 + -1) {
        *(undefined8 *)pPVar12 = *puVar11;
        puVar11 = puVar11 + (ulong)bVar15 * -2 + 1;
        pPVar12 = (PaintContext *)((long)pPVar12 + (ulong)bVar15 * -0x10 + 8);
      }
      QAbstractTextDocumentLayout::PaintContext::PaintContext(&pc,context);
      QTextFrame::iterator::currentBlock(&it);
      bVar3 = isEmptyBlockAfterTable((QTextBlock *)local_a8,pQVar7);
      if (bVar3) {
        QList<QAbstractTextDocumentLayout::Selection>::clear(&pc.selections);
      }
      QTextFrame::iterator::currentBlock(&it);
      drawBlock(this,offset,painter,&pc,(QTextBlock *)local_a8,bVar4);
      QAbstractTextDocumentLayout::PaintContext::~PaintContext(&pc);
    }
    else {
      drawFrame(this,offset,painter,context,pQVar13);
    }
    QTextBlock::blockFormat((QTextBlock *)&pc);
    bVar3 = isEmptyBlockBeforeTable(&local_48,(QTextBlockFormat *)&pc,&it);
    if (bVar3) {
      bVar3 = QTextBlock::contains(&local_48,context->cursorPosition);
      QTextFormat::~QTextFormat((QTextFormat *)&pc);
      if (bVar3) {
        cursorBlockNeedingRepaint->p = local_48.p;
        cursorBlockNeedingRepaint->n = local_48.n;
      }
    }
    else {
      QTextFormat::~QTextFormat((QTextFormat *)&pc);
    }
    QTextFrame::iterator::currentBlock(&it);
    local_48.p = (QTextDocumentPrivate *)CONCAT44(pc._4_4_,pc.cursorPosition);
    local_48.n = (int)pc.palette.d;
    QTextFrame::iterator::operator++(&it);
    pQVar7 = pQVar13;
    pQVar13 = it.cf;
    iVar14 = it.cb;
    iVar5 = it.e;
  }
  for (uVar10 = 0; uVar10 < (ulong)(floats->d).size; uVar10 = uVar10 + 1) {
    pQVar13 = (floats->d).ptr[uVar10];
    bVar4 = isFrameFromInlineObject(pQVar13);
    if (bVar4) {
      QTextFrame::frameFormat((QTextFrame *)&pc);
      PVar6 = QTextFrameFormat::position((QTextFrameFormat *)&pc);
      QTextFormat::~QTextFormat((QTextFormat *)&pc);
      if (PVar6 != InFlow) {
        iVar5 = QTextFrame::firstPosition(pQVar13);
        local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QAbstractTextDocumentLayout::format((QAbstractTextDocumentLayout *)local_a8,(int)this_00);
        objectType = QTextFormat::objectType((QTextFormat *)local_a8);
        this_01 = (QTextDocumentLayoutPrivate *)(ulong)objectType;
        pQVar8 = QAbstractTextDocumentLayout::handlerForObject(this_00,objectType);
        if (pQVar8 != (QTextObjectInterface *)0x0) {
          pc.palette.currentGroup = ~Active;
          pc.palette._12_4_ = 0xffffffff;
          pc.clip.xp._0_4_ = 0xffffffff;
          pc.clip.xp._4_4_ = 0xffffffff;
          pc.cursorPosition = -1;
          pc._4_4_ = 0xffffffff;
          pc.palette.d._0_4_ = -1;
          pc.palette.d._4_4_ = 0xffffffff;
          frameBoundingRectInternal((QRectF *)&pc,this_01,pQVar13);
          (*pQVar8->_vptr_QTextObjectInterface[3])
                    (pQVar8,painter,&pc,(this->super_QAbstractTextDocumentLayoutPrivate).document,
                     (ulong)(iVar5 - 1),(QTextFormat *)local_a8);
        }
        QTextFormat::~QTextFormat((QTextFormat *)local_a8);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentLayoutPrivate::drawFlow(const QPointF &offset, QPainter *painter, const QAbstractTextDocumentLayout::PaintContext &context,
                                          QTextFrame::Iterator it, const QList<QTextFrame *> &floats, QTextBlock *cursorBlockNeedingRepaint) const
{
    Q_Q(const QTextDocumentLayout);
    const bool inRootFrame = (!it.atEnd() && it.parentFrame() && it.parentFrame()->parentFrame() == nullptr);

    auto lastVisibleCheckPoint = checkPoints.end();
    if (inRootFrame && context.clip.isValid()) {
        lastVisibleCheckPoint = std::lower_bound(checkPoints.begin(), checkPoints.end(), QFixed::fromReal(context.clip.bottom()));
    }

    QTextBlock previousBlock;
    QTextFrame *previousFrame = nullptr;

    for (; !it.atEnd(); ++it) {
        QTextFrame *c = it.currentFrame();

        if (inRootFrame && !checkPoints.isEmpty()) {
            int currentPosInDoc;
            if (c)
                currentPosInDoc = c->firstPosition();
            else
                currentPosInDoc = it.currentBlock().position();

            // if we're past what is already laid out then we're better off
            // not trying to draw things that may not be positioned correctly yet
            if (currentPosInDoc >= checkPoints.constLast().positionInFrame)
                break;

            if (lastVisibleCheckPoint != checkPoints.end()
                && context.clip.isValid()
                && currentPosInDoc >= lastVisibleCheckPoint->positionInFrame
               )
                break;
        }

        if (c)
            drawFrame(offset, painter, context, c);
        else {
            QAbstractTextDocumentLayout::PaintContext pc = context;
            if (isEmptyBlockAfterTable(it.currentBlock(), previousFrame))
                pc.selections.clear();
            drawBlock(offset, painter, pc, it.currentBlock(), inRootFrame);
        }

        // when entering a table and the previous block is empty
        // then layoutFlow 'hides' the block that just causes a
        // new line by positioning it /on/ the table border. as we
        // draw that block before the table itself the decoration
        // 'overpaints' the cursor and we need to paint it afterwards
        // again
        if (isEmptyBlockBeforeTable(previousBlock, previousBlock.blockFormat(), it)
            && previousBlock.contains(context.cursorPosition)
           ) {
            *cursorBlockNeedingRepaint = previousBlock;
        }

        previousBlock = it.currentBlock();
        previousFrame = c;
    }

    for (int i = 0; i < floats.size(); ++i) {
        QTextFrame *frame = floats.at(i);
        if (!isFrameFromInlineObject(frame)
            || frame->frameFormat().position() == QTextFrameFormat::InFlow)
            continue;

        const int pos = frame->firstPosition() - 1;
        QTextCharFormat format = const_cast<QTextDocumentLayout *>(q)->format(pos);
        QTextObjectInterface *handler = q->handlerForObject(format.objectType());
        if (handler) {
            QRectF rect = frameBoundingRectInternal(frame);
            handler->drawObject(painter, rect, document, pos, format);
        }
    }
}